

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  bool bVar1;
  EnumDescriptorProto *in_RDI;
  bool local_1;
  
  value(in_RDI);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>>
                    ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)in_RDI);
  if (bVar1) {
    bVar1 = has_options((EnumDescriptorProto *)0x517b93);
    if ((!bVar1) || (bVar1 = EnumOptions::IsInitialized((EnumOptions *)in_RDI), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->value())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}